

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O2

REF_STATUS ref_node_tri_fitness(REF_NODE ref_node,REF_INT *nodes,REF_DBL *fitness)

{
  int iVar1;
  int iVar2;
  int iVar3;
  REF_DBL *pRVar4;
  undefined1 auVar5 [16];
  bool bVar6;
  undefined8 uVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  bool bVar13;
  double dVar14;
  double dVar15;
  byte bVar16;
  double dVar17;
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  REF_DBL r13 [3];
  REF_DBL r12 [3];
  REF_DBL e20 [3];
  REF_DBL rhy [3];
  REF_DBL e12 [3];
  REF_DBL e01 [3];
  
  *fitness = -1.0;
  iVar1 = nodes[1];
  iVar2 = *nodes;
  iVar3 = nodes[2];
  pRVar4 = ref_node->real;
  for (lVar10 = 0; lVar10 != 0x18; lVar10 = lVar10 + 8) {
    dVar14 = *(double *)((long)pRVar4 + lVar10 + (long)(iVar1 * 0xf) * 8);
    dVar15 = *(double *)((long)pRVar4 + lVar10 + (long)(iVar2 * 0xf) * 8);
    *(double *)((long)e01 + lVar10) = dVar14 - dVar15;
    dVar18 = *(double *)((long)pRVar4 + lVar10 + (long)(iVar3 * 0xf) * 8);
    *(double *)((long)e12 + lVar10) = dVar18 - dVar14;
    *(double *)((long)e20 + lVar10) = dVar15 - dVar18;
  }
  lVar10 = 0xffffffff;
  dVar14 = e12[2] * e12[2] + e12[0] * e12[0] + e12[1] * e12[1];
  dVar15 = e01[2] * e01[2] + e01[0] * e01[0] + e01[1] * e01[1];
  if (dVar15 <= dVar14) {
    dVar18 = e20[2] * e20[2] + e20[0] * e20[0] + e20[1] * e20[1];
    bVar6 = true;
    if (dVar18 <= dVar14) {
      bVar6 = false;
      lVar10 = 0;
    }
  }
  else {
    dVar18 = e20[2] * e20[2] + e20[0] * e20[0] + e20[1] * e20[1];
    bVar6 = true;
  }
  bVar16 = -(dVar15 <= dVar18) & -(dVar14 <= dVar18);
  uVar9 = (uint)(byte)~bVar16;
  lVar12 = 2;
  if (!bVar6) {
    lVar12 = lVar10;
  }
  bVar13 = (bVar16 & 1) == 0;
  lVar10 = 1;
  if (bVar13) {
    lVar10 = lVar12;
  }
  uVar8 = (ulong)(bVar6 ^ 1);
  if (!bVar13) {
    uVar8 = 2;
  }
  uVar11 = 2;
  if (!bVar13) {
    uVar11 = (ulong)(uVar9 & 1);
  }
  if (bVar6 != false) {
    uVar11 = (ulong)uVar9 & 0xffffffff00000001;
  }
  iVar1 = nodes[uVar11];
  iVar2 = nodes[uVar8];
  iVar3 = nodes[lVar10];
  for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
    dVar14 = pRVar4[iVar2 * 0xf + lVar10];
    r12[lVar10] = pRVar4[iVar1 * 0xf + lVar10] - dVar14;
    r13[lVar10] = pRVar4[iVar3 * 0xf + lVar10] - dVar14;
  }
  dVar15 = r12[2] * r12[2] + r12[0] * r12[0] + r12[1] * r12[1];
  auVar20._0_8_ = dVar15 * 1e+20;
  dVar14 = r12[2] * r13[2] + r12[0] * r13[0] + r12[1] * r13[1];
  auVar20._8_8_ = dVar14;
  auVar21._8_8_ = -dVar14;
  auVar21._0_8_ = -auVar20._0_8_;
  auVar21 = maxpd(auVar20,auVar21);
  if (auVar21._0_8_ <= auVar21._8_8_) {
    uVar7 = 0x9a5;
  }
  else {
    dVar14 = dVar14 / dVar15;
    for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
      rhy[lVar10] = r12[lVar10] * -dVar14 + r13[lVar10];
    }
    dVar17 = SQRT(rhy[2] * rhy[2] + rhy[0] * rhy[0] + rhy[1] * rhy[1]);
    dVar18 = dVar17 * 1e+20;
    dVar14 = (-dVar14 * dVar14 + dVar14) * SQRT(dVar15) * 0.5;
    auVar19._8_8_ = dVar14;
    auVar19._0_8_ = dVar18;
    auVar5._8_8_ = -dVar14;
    auVar5._0_8_ = -dVar18;
    auVar21 = maxpd(auVar19,auVar5);
    if (auVar21._8_8_ < auVar21._0_8_) {
      *fitness = dVar14 / dVar17;
      return 0;
    }
    uVar7 = 0x9b1;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar7,
         "ref_node_tri_fitness",4,"divide by longest edge");
  return 4;
}

Assistant:

REF_FCN REF_STATUS ref_node_tri_fitness(REF_NODE ref_node, REF_INT *nodes,
                                        REF_DBL *fitness) {
  REF_DBL e01[3], e12[3], e20[3], r12[3], r13[3], rhy[3];
  REF_INT i, node0, node1, node2;
  REF_DBL s, num, hx, hy;

  *fitness = -1.0;

  node0 = 0;
  node1 = 1;
  node2 = 2;
  for (i = 0; i < 3; i++) {
    e01[i] = ref_node_xyz(ref_node, i, nodes[node1]) -
             ref_node_xyz(ref_node, i, nodes[node0]);
    e12[i] = ref_node_xyz(ref_node, i, nodes[node2]) -
             ref_node_xyz(ref_node, i, nodes[node1]);
    e20[i] = ref_node_xyz(ref_node, i, nodes[node0]) -
             ref_node_xyz(ref_node, i, nodes[node2]);
  }
  node0 = 0;
  if (ref_math_dot(e12, e12) >= ref_math_dot(e01, e01) &&
      ref_math_dot(e12, e12) >= ref_math_dot(e20, e20))
    node0 = 1;
  if (ref_math_dot(e20, e20) >= ref_math_dot(e01, e01) &&
      ref_math_dot(e20, e20) >= ref_math_dot(e12, e12))
    node0 = 2;
  node1 = node0 + 1;
  node2 = node0 + 2;
  if (node1 > 2) node1 -= 3;
  if (node2 > 2) node2 -= 3;

  for (i = 0; i < 3; i++) {
    r12[i] = ref_node_xyz(ref_node, i, nodes[node1]) -
             ref_node_xyz(ref_node, i, nodes[node0]);
    r13[i] = ref_node_xyz(ref_node, i, nodes[node2]) -
             ref_node_xyz(ref_node, i, nodes[node0]);
  }
  if (ref_math_divisible(ref_math_dot(r12, r13), ref_math_dot(r12, r12))) {
    s = ref_math_dot(r12, r13) / ref_math_dot(r12, r12);
  } else {
    s = 0.0;
    RSS(REF_DIV_ZERO, "divide by longest edge");
  }
  hx = sqrt(ref_math_dot(r12, r12));
  for (i = 0; i < 3; i++) {
    rhy[i] = (r13[i] - s * r12[i]);
  }
  hy = sqrt(ref_math_dot(rhy, rhy));

  num = 0.5 * hx * (s - s * s);
  if (ref_math_divisible(num, hy)) {
    *fitness = num / hy;
  } else {
    RSS(REF_DIV_ZERO, "divide by longest edge");
  }

  return REF_SUCCESS;
}